

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_index_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint uVar1;
  uint local_1c;
  uint32_t tlb_index;
  uint32_t index_p;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  local_1c = env->CP0_Index & 0x80000000;
  uVar1 = (uint)arg1 & 0x7fffffff;
  if (uVar1 < env->tlb->nb_tlb) {
    if ((env->insn_flags & 0x2000) != 0) {
      local_1c = local_1c | (uint)arg1 & 0x80000000;
    }
    env->CP0_Index = local_1c | uVar1;
  }
  return;
}

Assistant:

void helper_mtc0_index(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t index_p = env->CP0_Index & 0x80000000;
    uint32_t tlb_index = arg1 & 0x7fffffff;
    if (tlb_index < env->tlb->nb_tlb) {
        if (env->insn_flags & ISA_MIPS32R6) {
            index_p |= arg1 & 0x80000000;
        }
        env->CP0_Index = index_p | tlb_index;
    }
}